

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O2

void __thiscall
duckdb::Deserializer::ReadPropertyWithDefault<unsigned_char>
          (Deserializer *this,field_id_t field_id,char *tag,uchar *ret)

{
  uchar uVar1;
  uint uVar2;
  undefined6 in_register_00000032;
  int iVar3;
  
  uVar2 = (*this->_vptr_Deserializer[4])(this,CONCAT62(in_register_00000032,field_id));
  if ((char)uVar2 == '\0') {
    uVar1 = '\0';
  }
  else {
    iVar3 = (*this->_vptr_Deserializer[0xf])(this);
    uVar1 = (uchar)iVar3;
  }
  *ret = uVar1;
  (*this->_vptr_Deserializer[5])(this,(ulong)(uVar2 & 0xff));
  return;
}

Assistant:

inline void ReadPropertyWithDefault(const field_id_t field_id, const char *tag, T &ret) {
		if (!OnOptionalPropertyBegin(field_id, tag)) {
			ret = std::forward<T>(SerializationDefaultValue::GetDefault<T>());
			OnOptionalPropertyEnd(false);
			return;
		}
		ret = Read<T>();
		OnOptionalPropertyEnd(true);
	}